

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# repair.cc
# Opt level: O1

void __thiscall
leveldb::(anonymous_namespace)::Repairer::ConvertLogToTable(unsigned_long)::LogReporter::
Corruption(unsigned_long,leveldb::Status_const__(void *this,size_t bytes,Status *s)

{
  Logger *info_log;
  undefined8 uVar1;
  string local_40;
  
  info_log = *(Logger **)((long)this + 0x10);
  uVar1 = *(undefined8 *)((long)this + 0x18);
  Status::ToString_abi_cxx11_(&local_40,s);
  Log(info_log,"Log #%llu: dropping %d bytes; %s",uVar1,bytes & 0xffffffff,local_40._M_dataplus._M_p
     );
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_40._M_dataplus._M_p != &local_40.field_2) {
    operator_delete(local_40._M_dataplus._M_p,local_40.field_2._M_allocated_capacity + 1);
  }
  return;
}

Assistant:

void Corruption(size_t bytes, const Status& s) override {
        // We print error messages for corruption, but continue repairing.
        Log(info_log, "Log #%llu: dropping %d bytes; %s",
            (unsigned long long)lognum, static_cast<int>(bytes),
            s.ToString().c_str());
      }